

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receptor.cpp
# Opt level: O0

void __thiscall indk::Neuron::Receptor::doPrepare(Receptor *this)

{
  reference ppPVar1;
  Receptor *this_local;
  
  std::vector<indk::Position_*,_std::allocator<indk::Position_*>_>::clear(&this->CPf);
  this->Rs = 0.01;
  this->Lf = 0.0;
  this->Fi = 0.0;
  this->dFi = 0.0;
  if ((this->Locked & 1U) == 0) {
    ppPVar1 = std::vector<indk::Position_*,_std::allocator<indk::Position_*>_>::operator[]
                        (&this->ReferencePos,this->Scope);
    Position::setPosition(*ppPVar1,this->DefaultPos);
  }
  else {
    Position::setPosition(this->PhantomPos,this->DefaultPos);
  }
  return;
}

Assistant:

void indk::Neuron::Receptor::doPrepare() {
    CPf.clear();
    Rs = 0.01;
    Lf = 0;
    Fi = 0;
    dFi = 0;
    if (Locked) PhantomPos -> setPosition(DefaultPos);
    else ReferencePos[Scope] -> setPosition(DefaultPos);
}